

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

void deqp::gles31::bb::anon_unknown_11::generateImmScalarVectorSrc
               (ostream *src,DataType basicType,void *valuePtr)

{
  DataType DVar1;
  uint uVar2;
  char *pcVar3;
  ostream *poVar4;
  long lVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int precision;
  ulong uVar6;
  long lVar7;
  string local_50;
  
  DVar1 = glu::getDataTypeScalarType(basicType);
  uVar2 = glu::getDataTypeScalarSize(basicType);
  precision = extraout_EDX;
  if (1 < (int)uVar2) {
    pcVar3 = glu::getDataTypeName(basicType);
    poVar4 = std::operator<<(src,pcVar3);
    std::operator<<(poVar4,"(");
    precision = extraout_EDX_00;
  }
  lVar7 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  do {
    if (uVar6 * 4 == lVar7) {
      if (1 < (int)uVar2) {
        std::operator<<(src,")");
      }
      return;
    }
    if (lVar7 != 0) {
      std::operator<<(src,", ");
      precision = extraout_EDX_01;
    }
    lVar5 = (long)(int)lVar7;
    if (DVar1 == TYPE_BOOL) {
      pcVar3 = "true";
      poVar4 = src;
      if (*(int *)((long)valuePtr + lVar5) == 0) {
        pcVar3 = "false";
      }
LAB_005d41d4:
      std::operator<<(poVar4,pcVar3);
      precision = extraout_EDX_04;
    }
    else if (DVar1 == TYPE_INT) {
      std::ostream::operator<<(src,*(int *)((long)valuePtr + lVar5));
      precision = extraout_EDX_03;
    }
    else {
      if (DVar1 == TYPE_UINT) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)src);
        pcVar3 = "u";
        goto LAB_005d41d4;
      }
      if (DVar1 == TYPE_FLOAT) {
        de::floatToString_abi_cxx11_
                  (&local_50,(de *)0x1,*(float *)((long)valuePtr + lVar5),precision);
        std::operator<<(src,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        precision = extraout_EDX_02;
      }
    }
    lVar7 = lVar7 + 4;
  } while( true );
}

Assistant:

void generateImmScalarVectorSrc (std::ostream& src, glu::DataType basicType, const void* valuePtr)
{
	DE_ASSERT(glu::isDataTypeFloatOrVec(basicType)	||
			  glu::isDataTypeIntOrIVec(basicType)	||
			  glu::isDataTypeUintOrUVec(basicType)	||
			  glu::isDataTypeBoolOrBVec(basicType));

	const glu::DataType		scalarType		= glu::getDataTypeScalarType(basicType);
	const int				scalarSize		= glu::getDataTypeScalarSize(basicType);
	const int				compSize		= sizeof(deUint32);

	if (scalarSize > 1)
		src << glu::getDataTypeName(basicType) << "(";

	for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
	{
		const deUint8* compPtr = (const deUint8*)valuePtr + scalarNdx*compSize;

		if (scalarNdx > 0)
			src << ", ";

		switch (scalarType)
		{
			case glu::TYPE_FLOAT:	src << de::floatToString(*((const float*)compPtr), 1);			break;
			case glu::TYPE_INT:		src << *((const int*)compPtr);									break;
			case glu::TYPE_UINT:	src << *((const deUint32*)compPtr) << "u";						break;
			case glu::TYPE_BOOL:	src << (*((const deUint32*)compPtr) != 0u ? "true" : "false");	break;
			default:
				DE_ASSERT(false);
		}
	}

	if (scalarSize > 1)
		src << ")";
}